

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O1

void __thiscall xmrig::App::onSignal(App *this,int signum)

{
  char *fmt;
  
  if (signum == 1) {
    fmt = "SIGHUP received, exiting";
  }
  else if (signum == 2) {
    fmt = "SIGINT received, exiting";
  }
  else {
    if (signum != 0xf) {
      return;
    }
    fmt = "SIGTERM received, exiting";
  }
  Log::print(WARNING,fmt);
  close(this,(int)fmt);
  return;
}

Assistant:

void xmrig::App::onSignal(int signum)
{
    switch (signum)
    {
    case SIGHUP:
        LOG_WARN("SIGHUP received, exiting");
        break;

    case SIGTERM:
        LOG_WARN("SIGTERM received, exiting");
        break;

    case SIGINT:
        LOG_WARN("SIGINT received, exiting");
        break;

    default:
        return;
    }

    close();
}